

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Var::clear_sources(Var *this,bool remove_parent)

{
  _Hash_node_base *p_Var1;
  
  p_Var1 = (this->sources_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0 && remove_parent) {
    do {
      (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[9]._M_nxt)();
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->sources_)._M_h);
  return;
}

Assistant:

void Var::clear_sources(bool remove_parent) {  // NOLINT
    if (remove_parent) {
        for (auto const &stmt : sources_) {
            stmt->remove_from_parent();
        }
    }

    sources_.clear();
}